

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_layer.cpp
# Opt level: O0

void __thiscall ON_Layer::~ON_Layer(ON_Layer *this)

{
  ON_LayerPrivate *this_00;
  ON_Layer *this_local;
  
  (this->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object =
       (_func_int **)&PTR_ClassId_00b71500;
  if ((this->m_private != (ON_LayerPrivate *)0x0) &&
     (this_00 = this->m_private, this_00 != (ON_LayerPrivate *)0x0)) {
    ON_LayerPrivate::~ON_LayerPrivate(this_00);
    operator_delete(this_00,0x18);
  }
  ON_RenderingAttributes::~ON_RenderingAttributes(&this->m_rendering_attributes);
  ON_ModelComponent::~ON_ModelComponent(&this->super_ON_ModelComponent);
  return;
}

Assistant:

ON_Layer::~ON_Layer()
{
  if (m_private)
    delete m_private;
}